

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::MaybeLogToStderr(LogSeverity severity,char *message,size_t len)

{
  size_t len_local;
  char *message_local;
  LogSeverity severity_local;
  
  if ((fLI::FLAGS_stderrthreshold <= severity) || ((fLB::FLAGS_alsologtostderr & 1) != 0)) {
    ColoredWriteToStderr(severity,message,len);
  }
  return;
}

Assistant:

inline void LogDestination::MaybeLogToStderr(LogSeverity severity,
					     const char* message, size_t len) {
  if ((severity >= FLAGS_stderrthreshold) || FLAGS_alsologtostderr) {
    ColoredWriteToStderr(severity, message, len);
#ifdef OS_WINDOWS
    // On Windows, also output to the debugger
    ::OutputDebugStringA(string(message,len).c_str());
#endif
  }
}